

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DICEPS.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ostream *poVar3;
  time_t tVar4;
  DecPOMDPDiscreteInterface *pDVar5;
  DICEPSPlanner *this;
  uint uVar6;
  int iVar7;
  long lVar8;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  allocator<char> local_921;
  tms ts_before;
  PlanningUnitMADPDiscreteParameters local_8f1;
  undefined4 local_8f0;
  undefined2 local_8ec;
  undefined1 local_8ea;
  double local_8e8;
  ulong local_8e0;
  double local_8d8;
  long local_8d0;
  tms ts_after;
  char formvalue [10];
  string filename;
  Timing Time;
  string convergenceFilename;
  string timingsFilename;
  ofstream of;
  byte abStack_7d0 [480];
  Arguments args;
  stringstream ss;
  ostream local_3a8 [376];
  ofstream conv_of;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"DICE: direct CE Policy Search");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"-----------------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  ArgumentHandlers::Arguments::Arguments(&args);
  argp_parse(ArgumentHandlers::theArgpStruc,argc,argv,0,0,&args);
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  local_8e0 = (ulong)args.horizon;
  poVar3 = std::operator<<((ostream *)&std::cout,"Horizon = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)local_8e0);
  std::endl<char,std::char_traits<char>>(poVar3);
  Timing::Timing(&Time);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&of,"Overall",(allocator<char> *)&conv_of);
  Timing::Start((string *)&Time);
  std::__cxx11::string::~string((string *)&of);
  pDVar5 = (DecPOMDPDiscreteInterface *)ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs(&args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,"/dev/null",(allocator<char> *)&of);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&timingsFilename,"/dev/null",(allocator<char> *)&of);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&convergenceFilename,"/dev/null",(allocator<char> *)&of);
  std::ofstream::ofstream(&of);
  std::ofstream::ofstream(&conv_of);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ts_after,"DICEPS",(allocator<char> *)formvalue);
  directories::MADPGetResultsFilename
            ((string *)&ts_before,(MultiAgentDecisionProcessInterface *)&ts_after,
             (Arguments *)(pDVar5 + *(long *)(*(long *)pDVar5 + -0x40)));
  poVar3 = std::operator<<(local_3a8,(string *)&ts_before);
  poVar3 = std::operator<<(poVar3,"h");
  std::ostream::operator<<(poVar3,(int)local_8e0);
  std::__cxx11::string::~string((string *)&ts_before);
  std::__cxx11::string::~string((string *)&ts_after);
  poVar3 = std::operator<<(local_3a8,"_CEr");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"_i");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"_s");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"_sfu");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"_a");
  poVar3 = std::ostream::_M_insert<double>(args.CE_alpha);
  poVar3 = std::operator<<(poVar3,"_ht");
  poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  poVar3 = std::operator<<(poVar3,"_evals");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  if (args.dryrun == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ts_before,"DICEPS",(allocator<char> *)&ts_after);
    directories::MADPCreateResultsDir
              ((string *)&ts_before,
               (MultiAgentDecisionProcessInterface *)(pDVar5 + *(long *)(*(long *)pDVar5 + -0x40)));
    std::__cxx11::string::~string((string *)&ts_before);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&filename,(string *)&ts_before);
    std::__cxx11::string::~string((string *)&ts_before);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ts_before,
                   &filename,"_Timings");
    std::__cxx11::string::operator=((string *)&timingsFilename,(string *)&ts_before);
    std::__cxx11::string::~string((string *)&ts_before);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ts_before,
                   &filename,"_convergence");
    std::__cxx11::string::operator=((string *)&convergenceFilename,(string *)&ts_before);
    std::__cxx11::string::~string((string *)&ts_before);
  }
  std::ofstream::open((char *)&of,(_Ios_Openmode)filename._M_dataplus._M_p);
  if ((abStack_7d0[*(long *)(_of + -0x18)] & 5) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Computing ");
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<(poVar3,(string *)&ts_before);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&ts_before);
    poVar3 = std::operator<<((ostream *)&of,"#horiz.");
    std::operator<<(poVar3,"\t");
    poVar3 = std::operator<<((ostream *)&of,"value     ");
    std::operator<<(poVar3,"\t");
    poVar3 = std::operator<<((ostream *)&of,"wctime");
    std::operator<<(poVar3,"\t");
    poVar3 = std::operator<<((ostream *)&of,"utime ");
    std::operator<<(poVar3,"\t");
    poVar3 = std::operator<<((ostream *)&of,"stime ");
    std::operator<<(poVar3,"\t");
    poVar3 = std::operator<<((ostream *)&of,"found jpol index\t(1tick=1/");
    sysconf(2);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<(poVar3,"s)\n");
    std::ostream::flush();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ts_before,"PlanningUnit",(allocator<char> *)&ts_after);
    Timing::Start((string *)&Time);
    std::__cxx11::string::~string((string *)&ts_before);
    PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(&local_8f1);
    PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(&local_8f1,0));
    local_8ec = 0;
    local_8ea = args.sparse != 0;
    local_8f0 = 0x10000;
    this = (DICEPSPlanner *)operator_new(0x3b0);
    DICEPSPlanner::DICEPSPlanner
              (this,local_8e0,pDVar5,1,args.nrCEIterations,args.nrCESamples,
               args.nrCESamplesForUpdate,args.CE_use_hard_threshold,args.CE_alpha,
               args.nrCEEvaluationRuns,&local_8f1,false,&conv_of,args.verbose);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ts_before,"PlanningUnit",(allocator<char> *)&ts_after);
    Timing::Stop((string *)&Time);
    std::__cxx11::string::~string((string *)&ts_before);
    poVar3 = std::operator<<((ostream *)&std::cout,"DICEPSPlanner initialized");
    std::endl<char,std::char_traits<char>>(poVar3);
    local_8d0 = 0;
    local_8d8 = 0.0;
    for (uVar6 = 0; uVar6 < args.nrCERestarts; uVar6 = uVar6 + 1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)formvalue,"Plan",&local_921);
      Timing::Start((string *)&Time);
      std::__cxx11::string::~string((string *)formvalue);
      times((tms *)&ts_before);
      (**(code **)(*(long *)this + 0x18))();
      times((tms *)&ts_after);
      std::__cxx11::string::string<std::allocator<char>>((string *)formvalue,"Plan",&local_921);
      Timing::Stop((string *)&Time);
      std::__cxx11::string::~string((string *)formvalue);
      lVar8 = ts_after.tms_utime - ts_before.tms_utime;
      local_8e8 = (double)(**(code **)(*(long *)this + 0x98))();
      if (-1 < args.verbose) {
        std::operator<<((ostream *)&std::cout,"value=");
        poVar3 = std::ostream::_M_insert<double>(local_8e8);
        std::endl<char,std::char_traits<char>>(poVar3);
        if (args.verbose != 0) {
          (**(code **)(*(long *)this + 0xa0))((string *)formvalue);
          (**(code **)(*(long *)formvalue._0_8_ + 0x38))();
          boost::detail::shared_count::~shared_count((shared_count *)(formvalue + 8));
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
      }
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&of,(int)local_8e0);
      std::operator<<(poVar3,"\t");
      sprintf(formvalue,"%.6f",local_8e8);
      poVar3 = std::operator<<((ostream *)&of,formvalue);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<long>((long)&of);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<long>((long)&of);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<long>((long)&of);
      std::operator<<(poVar3,"\t");
      std::operator<<((ostream *)&of,"-1\n");
      std::ostream::flush();
      local_8d0 = local_8d0 + lVar8;
      local_8d8 = local_8d8 + local_8e8;
      if (args.nrCERestarts - 1 == (ulong)uVar6) {
        poVar3 = std::operator<<((ostream *)&of,"# h ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,args.horizon);
        poVar3 = std::operator<<(poVar3,"\t");
        std::operator<<(poVar3," avg DICEPS time (s): ");
        local_8e8 = (double)local_8d0;
        lVar8 = sysconf(2);
        auVar1._8_8_ = in_XMM2_Qb;
        auVar1._0_8_ = in_XMM2_Qa;
        auVar1 = vcvtusi2sd_avx512f(auVar1,args.nrCERestarts);
        poVar3 = std::ostream::_M_insert<double>((local_8e8 / (double)lVar8) / auVar1._0_8_);
        std::operator<<(poVar3," avg value: ");
        auVar2._8_8_ = in_XMM2_Qb;
        auVar2._0_8_ = in_XMM2_Qa;
        auVar1 = vcvtusi2sd_avx512f(auVar2,args.nrCERestarts);
        poVar3 = std::ostream::_M_insert<double>(local_8d8 / auVar1._0_8_);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ts_before,"Overall",(allocator<char> *)&ts_after);
    Timing::Stop((string *)&Time);
    std::__cxx11::string::~string((string *)&ts_before);
    if (-1 < args.verbose) {
      Timing::PrintSummary();
      TimedAlgorithm::PrintTimersSummary();
    }
    (**(code **)(*(long *)this + 8))();
    PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(&local_8f1);
    iVar7 = 0;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"could not open ");
    poVar3 = std::operator<<(poVar3,(string *)&filename);
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar7 = 1;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ofstream::~ofstream(&conv_of);
  std::ofstream::~ofstream(&of);
  std::__cxx11::string::~string((string *)&convergenceFilename);
  std::__cxx11::string::~string((string *)&timingsFilename);
  std::__cxx11::string::~string((string *)&filename);
  Timing::~Timing(&Time);
  std::__cxx11::string::~string((string *)&args.maxplus_updateT);
  return iVar7;
}

Assistant:

int main(int argc, char **argv)
{
    cout << "DICE: direct CE Policy Search"<<endl;
    cout << "-----------------------------"<<endl;
    // parse the command line arguments
    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    srand(time(0));


    int horizon = args.horizon;
    cout << "Horizon = " << horizon << endl;


    try {
    //start timers
    Timing Time;    
    Time.Start("Overall");

    DecPOMDPDiscreteInterface & decpomdp = * GetDecPOMDPDiscreteInterfaceFromArgs(args);

    // setup the output file stream 
    string filename="/dev/null",timingsFilename="/dev/null", 
           convergenceFilename="/dev/null";
    ofstream of, conv_of;
    stringstream ss;
    ss << directories::MADPGetResultsFilename("DICEPS",decpomdp,args)
        << "h" << horizon;
    // add the CE parameters into the output file name
    ss  << "_CEr" << args.nrCERestarts 
        << "_i" << args.nrCEIterations
        << "_s" << args.nrCESamples 
        << "_sfu" << args.nrCESamplesForUpdate
        << "_a" << args.CE_alpha 
        << "_ht" << args.CE_use_hard_threshold
        << "_evals" << args.nrCEEvaluationRuns;
    if(!args.dryrun)
    {
        directories::MADPCreateResultsDir("DICEPS",decpomdp);
        filename=ss.str();
        timingsFilename=filename + "_Timings";
        convergenceFilename=filename + "_convergence";
    }
    of.open(filename.c_str());
    if(!of)
    {
        cerr << "could not open " << filename << endl;
        return(1);
    }
    cout << "Computing " << ss.str() << endl;
    //write headers
    of << "#horiz."<<"\t";
    of << "value     " <<"\t";
    of << "wctime"<< "\t";
    of << "utime " <<"\t";
    of << "stime " <<"\t";
    of << "found jpol index\t(1tick=1/"<<sysconf(_SC_CLK_TCK)<<"s)\n";
    of.flush();
    
    //Initialization of the planner with typical options for JESP:
    Time.Start("PlanningUnit");
    PlanningUnitMADPDiscreteParameters params;
    params.SetComputeAll(true);
    params.SetComputeJointActionObservationHistories(false);
    params.SetComputeJointActionHistories(false);
    params.SetComputeIndividualActionObservationHistories(false);
    params.SetComputeIndividualActionHistories(false);
    //params.SetComputeIndividualObservationHistories(false);
    // joint observations histories are needed for
    // efficient computation of joint actions
    params.SetComputeJointObservationHistories(true);
    params.SetComputeJointBeliefs(false);
    if(args.sparse)
        params.SetUseSparseJointBeliefs(true);
    else
        params.SetUseSparseJointBeliefs(false);
    DICEPSPlanner* planner;
    planner = new DICEPSPlanner (
        horizon,
        &decpomdp,
        //CE params
        1, // the restarts loop is executed here, not in DICEPSPlanner
        args.nrCEIterations,
        args.nrCESamples,
        args.nrCESamplesForUpdate, 
        args.CE_use_hard_threshold, //(gamma in CE papers)
        args.CE_alpha, //the learning rate
        args.nrCEEvaluationRuns //the number of evaluation runs
        , &params
        , 
#if CONVERGENCE_STATS        
        true // convergence stats  
#else
        false        
#endif
        , &conv_of
        , args.verbose
    );
    Time.Stop("PlanningUnit");
    cout << "DICEPSPlanner initialized" << endl;

    clock_t total_utime_diceps=0;
    double total_value=0;
    for(Index restartI = 0; restartI < args.nrCERestarts; restartI++)
    {
        //start all timers:
        tms ts_before, ts_after;
        clock_t ticks_before, ticks_after;
        Time.Start("Plan");
        ticks_before = times(&ts_before);
        planner->Plan();
        //stop all timers
        ticks_after = times(&ts_after);
        Time.Stop("Plan");
        clock_t ticks =  ticks_after - ticks_before;
        clock_t utime =   ts_after.tms_utime - ts_before.tms_utime;
        clock_t stime =   ts_after.tms_stime - ts_before.tms_stime;

        total_utime_diceps+=utime;

        double V = planner->GetExpectedReward();
        if(args.verbose >= 0)
        {
            cout << "value="<< V << endl;
            if(args.verbose)        {
            planner->GetJointPolicyPureVector()->Print();
            cout <<  endl;
            }
        }
        total_value+=V;
        
        of << horizon<<"\t";
        char formvalue[10];
        sprintf(formvalue, "%.6f", V);
        of << formvalue <<"\t";
        of << ticks <<"\t";
        of << utime <<"\t";
        of << stime <<"\t";
        of << "-1\n";//Cannot get index of joint pol., since  "planner->GetJointPolicyPureVector()->GetIndex()" does not work
        of.flush();

        // output average statistics after completing the last restart
        if(restartI==(args.nrCERestarts-1))
            of << "# h " << args.horizon<<"\t"
               << " avg DICEPS time (s): "
               << (static_cast<double>(total_utime_diceps)/
                   sysconf(_SC_CLK_TCK))/args.nrCERestarts
               << " avg value: " << total_value/args.nrCERestarts
               << endl;
    }
    /* clean up */

    Time.Stop("Overall");

    if(args.verbose >= 0)
    {
        Time.PrintSummary();
        planner->PrintTimersSummary();
    }
#if 0
    if(//args.saveTimings && 
            !args.dryrun)
    {
        Time.Save(timingsFilename);
        planner->SaveTimers(timingsFilename);
    }
#endif
    delete planner;
    }
    catch(E& e){ e.Print(); }
}